

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ColorConvertHSVtoRGB(float h,float s,float v,float *out_r,float *out_g,float *out_b)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float t;
  float q;
  float p;
  float f;
  int i;
  float *out_b_local;
  float *out_g_local;
  float *out_r_local;
  float v_local;
  float s_local;
  float h_local;
  
  if ((s != 0.0) || (NAN(s))) {
    fVar2 = ImFmod(h,1.0);
    iVar1 = (int)(fVar2 / 0.16666667);
    fVar2 = fVar2 / 0.16666667 - (float)iVar1;
    fVar3 = v * (1.0 - s);
    fVar4 = v * (1.0 - s * fVar2);
    fVar2 = v * (1.0 - s * (1.0 - fVar2));
    switch(iVar1) {
    case 0:
      *out_r = v;
      *out_g = fVar2;
      *out_b = fVar3;
      break;
    case 1:
      *out_r = fVar4;
      *out_g = v;
      *out_b = fVar3;
      break;
    case 2:
      *out_r = fVar3;
      *out_g = v;
      *out_b = fVar2;
      break;
    case 3:
      *out_r = fVar3;
      *out_g = fVar4;
      *out_b = v;
      break;
    case 4:
      *out_r = fVar2;
      *out_g = fVar3;
      *out_b = v;
      break;
    case 5:
    default:
      *out_r = v;
      *out_g = fVar3;
      *out_b = fVar4;
    }
  }
  else {
    *out_b = v;
    *out_g = v;
    *out_r = v;
  }
  return;
}

Assistant:

void ImGui::ColorConvertHSVtoRGB(float h, float s, float v, float& out_r, float& out_g, float& out_b)
{
    if (s == 0.0f)
    {
        // gray
        out_r = out_g = out_b = v;
        return;
    }

    h = ImFmod(h, 1.0f) / (60.0f/360.0f);
    int   i = (int)h;
    float f = h - (float)i;
    float p = v * (1.0f - s);
    float q = v * (1.0f - s * f);
    float t = v * (1.0f - s * (1.0f - f));

    switch (i)
    {
    case 0: out_r = v; out_g = t; out_b = p; break;
    case 1: out_r = q; out_g = v; out_b = p; break;
    case 2: out_r = p; out_g = v; out_b = t; break;
    case 3: out_r = p; out_g = q; out_b = v; break;
    case 4: out_r = t; out_g = p; out_b = v; break;
    case 5: default: out_r = v; out_g = p; out_b = q; break;
    }
}